

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  int value;
  int value_00;
  char *pcVar3;
  undefined7 in_register_00000039;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  std::operator<<(os,"\'");
  iVar4 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    pcVar3 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0014aa0c_caseD_1:
    if (0x5e < (int)c - 0x20U) {
      String::FormatHexInt_abi_cxx11_(&local_48,(String *)(ulong)(byte)c,value);
      std::operator+(&bStack_68,"\\x",&local_48);
      std::operator<<(os,(string *)&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = true;
      goto LAB_0014aa97;
    }
    std::operator<<(os,c);
    goto LAB_0014aa94;
  case 7:
    pcVar3 = "\\a";
    break;
  case 8:
    pcVar3 = "\\b";
    break;
  case 9:
    pcVar3 = "\\t";
    break;
  case 10:
    pcVar3 = "\\n";
    break;
  case 0xb:
    pcVar3 = "\\v";
    break;
  case 0xc:
    pcVar3 = "\\f";
    break;
  case 0xd:
    pcVar3 = "\\r";
    break;
  default:
    if (iVar4 == 0x27) {
      pcVar3 = "\\\'";
    }
    else {
      if (iVar4 != 0x5c) goto switchD_0014aa0c_caseD_1;
      pcVar3 = "\\\\";
    }
  }
  std::operator<<(os,pcVar3);
LAB_0014aa94:
  bVar1 = false;
LAB_0014aa97:
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar2 = std::operator<<(os," (");
    std::ostream::operator<<(poVar2,(int)c);
    if (9 < (byte)c && !bVar1) {
      poVar2 = std::operator<<(os,", 0x");
      String::FormatHexInt_abi_cxx11_(&bStack_68,(String *)(ulong)(byte)c,value_00);
      std::operator<<(poVar2,(string *)&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}